

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_file(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int iVar3;
  int extraout_EDX;
  char *__s1;
  long *plVar4;
  uv_fs_event_t *puVar5;
  code **ppcVar6;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_218 [2];
  char acStack_208 [8];
  uv_fs_event_t auStack_200 [4];
  undefined8 uStack_38;
  long local_20;
  
  uVar2 = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  local_20 = (long)iVar1;
  if (local_20 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_00187efc;
    iVar1 = uv_timer_init(uVar2,&timer);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_00187f09;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_00187f16;
    uv_run(uVar2,0);
    local_20 = 1;
    if (fs_event_cb_called != 1) goto LAB_00187f23;
    local_20 = 2;
    if (timer_cb_called != 2) goto LAB_00187f30;
    local_20 = 2;
    if (close_cb_called != 2) goto LAB_00187f3d;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    local_20 = 0;
    iVar1 = uv_loop_close(uVar2);
    if (local_20 == iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00187efc:
    run_test_fs_event_watch_file_cold_2();
LAB_00187f09:
    run_test_fs_event_watch_file_cold_3();
LAB_00187f16:
    run_test_fs_event_watch_file_cold_4();
LAB_00187f23:
    run_test_fs_event_watch_file_cold_5();
LAB_00187f30:
    run_test_fs_event_watch_file_cold_6();
LAB_00187f3d:
    run_test_fs_event_watch_file_cold_7();
  }
  plVar4 = &local_20;
  run_test_fs_event_watch_file_cold_8();
  iVar3 = 0x41;
  apcStack_218[0] = (code *)0x187f7d;
  uStack_38 = uVar2;
  iVar1 = uv_fs_open(0,&auStack_200[0].loop,plVar4,0x41,0x180,0);
  auStack_200[0].data = (void *)(long)iVar1;
  acStack_208[0] = '\0';
  acStack_208[1] = '\0';
  acStack_208[2] = '\0';
  acStack_208[3] = '\0';
  acStack_208[4] = '\0';
  acStack_208[5] = '\0';
  acStack_208[6] = '\0';
  acStack_208[7] = '\0';
  if (auStack_200[0].data == (void *)0x0) {
    apcStack_218[0] = (code *)0x187fa9;
    uv_fs_req_cleanup(&auStack_200[0].loop);
    iVar3 = 0;
    apcStack_218[0] = (code *)0x187fb7;
    iVar1 = uv_fs_close(0,&auStack_200[0].loop,auStack_200[0].wd);
    auStack_200[0].data = (void *)(long)iVar1;
    acStack_208[0] = '\0';
    acStack_208[1] = '\0';
    acStack_208[2] = '\0';
    acStack_208[3] = '\0';
    acStack_208[4] = '\0';
    acStack_208[5] = '\0';
    acStack_208[6] = '\0';
    acStack_208[7] = '\0';
    if (auStack_200[0].data == (void *)0x0) {
      apcStack_218[0] = (code *)0x187fdd;
      iVar1 = uv_fs_req_cleanup(&auStack_200[0].loop);
      return iVar1;
    }
  }
  else {
    apcStack_218[0] = (code *)0x187ff6;
    create_file_cold_1();
  }
  puVar5 = auStack_200;
  __s1 = acStack_208;
  apcStack_218[0] = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar5 == &fs_event) {
    apcStack_218[0] = (code *)(long)iVar3;
    if (apcStack_218[0] != (code *)0x0) goto LAB_001880d3;
    apcStack_218[0] = (code *)(long)extraout_EDX;
    if (apcStack_218[0] != (code *)0x2) goto LAB_001880e2;
    iVar1 = strcmp(__s1,"file2");
    apcStack_218[0] = (code *)(long)iVar1;
    if (apcStack_218[0] == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      apcStack_218[0] = (code *)(long)iVar1;
      if (apcStack_218[0] == (code *)0x0) {
        iVar1 = uv_close(&fs_event,close_cb);
        return iVar1;
      }
      goto LAB_00188100;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_001880d3:
    fs_event_cb_file_cold_2();
LAB_001880e2:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00188100:
  ppcVar6 = apcStack_218;
  fs_event_cb_file_cold_5();
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    iVar1 = uv_close(ppcVar6,close_cb);
    return iVar1;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_watch_file) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "watch_dir/file2", 0);
  ASSERT_OK(r);
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);
  r = uv_timer_start(&timer, timer_cb_file, 100, 100);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, fs_event_cb_called);
  ASSERT_EQ(2, timer_cb_called);
  ASSERT_EQ(2, close_cb_called);

  /* Cleanup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}